

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

void __thiscall
wallet::CWallet::CommitTransaction
          (CWallet *this,CTransactionRef tx,mapValue_t mapValue,
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          orderForm)

{
  pointer pCVar1;
  undefined1 *puVar2;
  bool bVar3;
  CWalletTx *wtx;
  iterator iVar4;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  size_type __len;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  element_type *peVar7;
  uchar *puVar8;
  long in_FS_OFFSET;
  CTransactionRef tx_00;
  string err_string;
  undefined1 in_stack_ffffffffffffff48;
  pointer local_a8;
  pointer local_a0;
  unique_lock<std::recursive_mutex> local_98;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  string local_68;
  uchar local_40;
  long local_38;
  
  peVar7 = tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_98._M_device = &(this->cs_wallet).super_recursive_mutex;
  local_98._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_98);
  CTransaction::ToString_abi_cxx11_
            (&local_68,
             (CTransaction *)
             (peVar7->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start);
  if (local_68._M_string_length == 0) {
    local_88._0_8_ = 0;
  }
  else {
    local_88._0_8_ =
         local_68._M_string_length -
         ((local_68._M_dataplus._M_p + -1)[local_68._M_string_length] == '\n');
  }
  local_88._8_8_ = local_68._M_dataplus._M_p;
  WalletLogPrintf<std::basic_string_view<char,std::char_traits<char>>>
            (this,(ConstevalFormatString<1U>)0x4896ae,
             (basic_string_view<char,_std::char_traits<char>_> *)local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  local_a8 = (peVar7->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_a0 = (peVar7->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (local_a0 != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      puVar8 = (local_a0->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8;
      *(int *)puVar8 = *(int *)puVar8 + 1;
      UNLOCK();
    }
    else {
      puVar8 = (local_a0->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8;
      *(int *)puVar8 = *(int *)puVar8 + 1;
    }
  }
  local_68._M_dataplus._M_p = local_68._M_dataplus._M_p & 0xffffffffffffff00;
  local_40 = '\x03';
  local_78._8_8_ =
       std::
       _Function_handler<bool_(wallet::CWalletTx_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp:2323:57)>
       ::_M_invoke;
  local_78._0_8_ =
       std::
       _Function_handler<bool_(wallet::CWalletTx_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp:2323:57)>
       ::_M_manager;
  tx_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_68;
  tx_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_a8;
  local_88._0_8_ =
       tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._M_pi
  ;
  wtx = AddToWallet(this,tx_00,(TxState *)local_88,(UpdateWalletTxFn *)0x1,false,
                    (bool)in_stack_ffffffffffffff48);
  if ((code *)local_78._0_8_ != (code *)0x0) {
    (*(code *)local_78._0_8_)(local_88,local_88,3);
  }
  if (local_a0 != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0);
  }
  if (wtx == (CWalletTx *)0x0) {
LAB_0016522c:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_88._0_8_ = local_78;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"CommitTransaction","");
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_88,": Wallet db error, transaction commit failed");
    local_68._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
    paVar6 = &pbVar5->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == paVar6) {
      local_68.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
      local_68.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    }
    else {
      local_68.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    }
    local_68._M_string_length = pbVar5->_M_string_length;
    (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
    pbVar5->_M_string_length = 0;
    (pbVar5->field_2)._M_local_buf[0] = '\0';
    std::runtime_error::runtime_error(this_00,(string *)&local_68);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    pCVar1 = (peVar7->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar8 = *(uchar **)&(pCVar1->prevout).hash;
    puVar2 = *(undefined1 **)((long)&(pCVar1->prevout).hash + 8);
    if (puVar8 != puVar2) {
      do {
        iVar4 = std::
                _Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&(this->mapWallet)._M_h,(key_type *)puVar8);
        if (iVar4.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
            _M_cur == (__node_type *)0x0) {
          if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00165425;
          std::__throw_out_of_range("_Map_base::at");
          goto LAB_0016522c;
        }
        *(undefined8 *)
         ((long)iVar4.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
                _M_cur + 0x90) = 0;
        *(undefined8 *)
         ((long)iVar4.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
                _M_cur + 0xd8) = 0;
        *(undefined8 *)
         ((long)iVar4.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
                _M_cur + 0x120) = 0;
        *(undefined8 *)
         ((long)iVar4.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
                _M_cur + 0x168) = 0;
        *(undefined2 *)
         ((long)iVar4.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
                _M_cur + 0x1b0) = 1;
        boost::signals2::
        signal<void_(const_uint256_&,_ChangeType),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_uint256_&,_ChangeType)>,_boost::function<void_(const_boost::signals2::connection_&,_const_uint256_&,_ChangeType)>,_boost::signals2::mutex>
        ::operator()(&this->NotifyTransactionChanged,
                     (uint256 *)
                     (*(long *)((long)iVar4.
                                      super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                      ._M_cur + 0x1c0) + 0x39),CT_UPDATED);
        puVar8 = puVar8 + 0x68;
      } while (puVar8 != puVar2);
    }
    if (this->fBroadcastTransactions != false) {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      local_68._M_string_length = 0;
      local_68.field_2._M_allocated_capacity =
           local_68.field_2._M_allocated_capacity & 0xffffffffffffff00;
      bVar3 = SubmitTxMemoryPoolAndRelay(this,wtx,&local_68,true);
      if (!bVar3) {
        WalletLogPrintf<std::__cxx11::string>(this,(ConstevalFormatString<1U>)0x489704,&local_68);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_98);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
LAB_00165425:
  __stack_chk_fail();
}

Assistant:

void CWallet::CommitTransaction(CTransactionRef tx, mapValue_t mapValue, std::vector<std::pair<std::string, std::string>> orderForm)
{
    LOCK(cs_wallet);
    WalletLogPrintf("CommitTransaction:\n%s\n", util::RemoveSuffixView(tx->ToString(), "\n"));

    // Add tx to wallet, because if it has change it's also ours,
    // otherwise just for transaction history.
    CWalletTx* wtx = AddToWallet(tx, TxStateInactive{}, [&](CWalletTx& wtx, bool new_tx) {
        CHECK_NONFATAL(wtx.mapValue.empty());
        CHECK_NONFATAL(wtx.vOrderForm.empty());
        wtx.mapValue = std::move(mapValue);
        wtx.vOrderForm = std::move(orderForm);
        wtx.fTimeReceivedIsTxTime = true;
        wtx.fFromMe = true;
        return true;
    });

    // wtx can only be null if the db write failed.
    if (!wtx) {
        throw std::runtime_error(std::string(__func__) + ": Wallet db error, transaction commit failed");
    }

    // Notify that old coins are spent
    for (const CTxIn& txin : tx->vin) {
        CWalletTx &coin = mapWallet.at(txin.prevout.hash);
        coin.MarkDirty();
        NotifyTransactionChanged(coin.GetHash(), CT_UPDATED);
    }

    if (!fBroadcastTransactions) {
        // Don't submit tx to the mempool
        return;
    }

    std::string err_string;
    if (!SubmitTxMemoryPoolAndRelay(*wtx, err_string, true)) {
        WalletLogPrintf("CommitTransaction(): Transaction cannot be broadcast immediately, %s\n", err_string);
        // TODO: if we expect the failure to be long term or permanent, instead delete wtx from the wallet and return failure.
    }
}